

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  _func_CURLcode_connectdata_ptr__Bool *p_Var1;
  
  if ((data != (Curl_easy *)0x0 && conn != (connectdata *)0x0) &&
     ((conn->easyq).size == 0 || dead_connection)) {
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlock(data,conn->dns_entry);
      conn->dns_entry = (Curl_dns_entry *)0x0;
    }
    Curl_hostcache_prune(data);
    Curl_http_auth_cleanup_ntlm(conn);
    conn->data = data;
    p_Var1 = conn->handler->disconnect;
    if (p_Var1 != (_func_CURLcode_connectdata_ptr__Bool *)0x0) {
      (*p_Var1)(conn,*(int *)&(conn->bits).field_0x4 < 0 || dead_connection);
      data = conn->data;
    }
    Curl_infof(data,"Closing connection %ld\n",conn->connection_id);
    Curl_ssl_close(conn,0);
    Curl_ssl_close(conn,1);
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
    }
    if (conn->sock[0] != -1) {
      Curl_closesocket(conn,conn->sock[0]);
    }
    if (conn->tempsock[0] != -1) {
      Curl_closesocket(conn,conn->tempsock[0]);
    }
    if (conn->tempsock[1] != -1) {
      Curl_closesocket(conn,conn->tempsock[1]);
    }
    Curl_conncache_remove_conn(conn->data,conn,true);
    conn_free(conn);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_disconnect(struct Curl_easy *data,
                         struct connectdata *conn, bool dead_connection)
{
  if(!conn)
    return CURLE_OK; /* this is closed and fine already */

  if(!data) {
    DEBUGF(infof(data, "DISCONNECT without easy handle, ignoring\n"));
    return CURLE_OK;
  }

  /*
   * If this connection isn't marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !dead_connection) {
    DEBUGF(infof(data, "Curl_disconnect when inuse: %zu\n", CONN_INUSE(conn)));
    return CURLE_OK;
  }

  if(conn->dns_entry != NULL) {
    Curl_resolv_unlock(data, conn->dns_entry);
    conn->dns_entry = NULL;
  }

  Curl_hostcache_prune(data); /* kill old DNS cache entries */

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM)
  /* Cleanup NTLM connection-related data */
  Curl_http_auth_cleanup_ntlm(conn);
#endif
#if !defined(CURL_DISABLE_HTTP) && defined(USE_SPNEGO)
  /* Cleanup NEGOTIATE connection-related data */
  Curl_http_auth_cleanup_negotiate(conn);
#endif

  /* the protocol specific disconnect handler and conn_shutdown need a transfer
     for the connection! */
  conn->data = data;

  if(conn->bits.connect_only)
    /* treat the connection as dead in CONNECT_ONLY situations */
    dead_connection = TRUE;

  if(conn->handler->disconnect)
    /* This is set if protocol-specific cleanups should be made */
    conn->handler->disconnect(conn, dead_connection);

  conn_shutdown(conn);
  conn_free(conn);
  return CURLE_OK;
}